

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall cmCTestBuildHandler::ProcessSingleLine(cmCTestBuildHandler *this,char *data)

{
  cmCTest *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  reference pRVar7;
  reference pvVar8;
  string local_908 [32];
  undefined1 local_8e8 [8];
  ostringstream cmCTestLog_msg_4;
  RegularExpression *rx_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2_3;
  undefined1 local_730 [8];
  ostringstream cmCTestLog_msg_3;
  RegularExpression *rx_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2_2;
  string local_590 [4];
  int wrxCnt_1;
  undefined1 local_570 [8];
  ostringstream cmCTestLog_msg_2;
  RegularExpression *rx_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2_1;
  undefined1 local_3b8 [8];
  ostringstream cmCTestLog_msg_1;
  RegularExpression *rx;
  iterator __end2;
  iterator __begin2;
  vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *__range2;
  int wrxCnt;
  int errorLine;
  int warningLine;
  undefined1 local_1f0 [8];
  ostringstream cmCTestLog_msg;
  undefined1 local_78 [8];
  string line;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string input;
  char *data_local;
  cmCTestBuildHandler *this_local;
  
  if ((this->UseCTestLaunch & 1U) == 0) {
    input.field_2._8_8_ = data;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_40,data,&local_41);
    std::allocator<char>::~allocator(&local_41);
    std::__cxx11::string::string((string *)local_78);
    cmStringReplaceHelper::Replace(this->ColorRemover,(string *)local_40,(string *)local_78);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f0);
    poVar5 = std::operator<<((ostream *)local_1f0,"Line: [");
    poVar5 = std::operator<<(poVar5,(string *)local_78);
    poVar5 = std::operator<<(poVar5,"]");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                 ,0x477,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)&errorLine);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f0);
    bVar3 = false;
    bVar2 = false;
    if ((this->ErrorQuotaReached & 1U) == 0) {
      __range2._4_4_ = 0;
      __end2 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
               begin(&this->ErrorMatchRegex);
      rx = (RegularExpression *)
           std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                     (&this->ErrorMatchRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                         *)&rx), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar4 = cmsys::RegularExpression::find(pRVar7,pcVar6);
        if (bVar4) {
          bVar2 = true;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b8);
          poVar5 = std::operator<<((ostream *)local_3b8,"  Error Line: ");
          poVar5 = std::operator<<(poVar5,(string *)local_78);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomErrorMatches,(long)__range2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x488,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)&__range2_1);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b8);
          break;
        }
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2);
      }
      __range2._4_4_ = 0;
      __end2_1 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->ErrorExceptionRegex);
      rx_1 = (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                       (&this->ErrorExceptionRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_1,
                                (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                 *)&rx_1), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2_1);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar4 = cmsys::RegularExpression::find(pRVar7,pcVar6);
        if (bVar4) {
          bVar2 = false;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
          poVar5 = std::operator<<((ostream *)local_570,"  Not an error Line: ");
          poVar5 = std::operator<<(poVar5,(string *)local_78);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomErrorExceptions,(long)__range2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x497,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_590);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
          break;
        }
        __range2._4_4_ = __range2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2_1);
      }
    }
    if ((this->WarningQuotaReached & 1U) == 0) {
      __range2_2._4_4_ = 0;
      __end2_2 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->WarningMatchRegex);
      rx_2 = (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                       (&this->WarningMatchRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_2,
                                (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                 *)&rx_2), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2_2);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar4 = cmsys::RegularExpression::find(pRVar7,pcVar6);
        if (bVar4) {
          bVar3 = true;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_730);
          poVar5 = std::operator<<((ostream *)local_730,"  Warning Line: ");
          poVar5 = std::operator<<(poVar5,(string *)local_78);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomWarningMatches,(long)__range2_2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x4a8,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)&__range2_3);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_730);
          break;
        }
        __range2_2._4_4_ = __range2_2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2_2);
      }
      __range2_2._4_4_ = 0;
      __end2_3 = std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::
                 begin(&this->WarningExceptionRegex);
      rx_3 = (RegularExpression *)
             std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::end
                       (&this->WarningExceptionRegex);
      while (bVar4 = __gnu_cxx::operator!=
                               (&__end2_3,
                                (__normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                                 *)&rx_3), bVar4) {
        pRVar7 = __gnu_cxx::
                 __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
                 ::operator*(&__end2_3);
        pcVar6 = (char *)std::__cxx11::string::c_str();
        bVar4 = cmsys::RegularExpression::find(pRVar7,pcVar6);
        if (bVar4) {
          bVar3 = false;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8e8);
          poVar5 = std::operator<<((ostream *)local_8e8,"  Not a warning Line: ");
          poVar5 = std::operator<<(poVar5,(string *)local_78);
          poVar5 = std::operator<<(poVar5," (matches: ");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[](&this->CustomWarningExceptions,(long)__range2_2._4_4_);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          poVar5 = std::operator<<(poVar5,")");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x4b8,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_908);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8e8);
          break;
        }
        __range2_2._4_4_ = __range2_2._4_4_ + 1;
        __gnu_cxx::
        __normal_iterator<cmsys::RegularExpression_*,_std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>_>
        ::operator++(&__end2_3);
      }
    }
    if (bVar2) {
      this_local._4_4_ = 2;
    }
    else if (bVar3) {
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 0;
    }
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::ProcessSingleLine(const char* data)
{
  if (this->UseCTestLaunch) {
    // No log scraping when using launchers.
    return b_REGULAR_LINE;
  }

  // Ignore ANSI color codes when checking for errors and warnings.
  std::string input(data);
  std::string line;
  this->ColorRemover->Replace(input, line);

  cmCTestOptionalLog(this->CTest, DEBUG, "Line: [" << line << "]" << std::endl,
                     this->Quiet);

  int warningLine = 0;
  int errorLine = 0;

  // Check for regular expressions

  if (!this->ErrorQuotaReached) {
    // Errors
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorMatchRegex) {
      if (rx.find(line.c_str())) {
        errorLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Error Line: " << line << " (matches: "
                                            << this->CustomErrorMatches[wrxCnt]
                                            << ")" << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
    // Error exceptions
    wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->ErrorExceptionRegex) {
      if (rx.find(line.c_str())) {
        errorLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not an error Line: "
                             << line << " (matches: "
                             << this->CustomErrorExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (!this->WarningQuotaReached) {
    // Warnings
    int wrxCnt = 0;
    for (cmsys::RegularExpression& rx : this->WarningMatchRegex) {
      if (rx.find(line.c_str())) {
        warningLine = 1;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Warning Line: "
                             << line << " (matches: "
                             << this->CustomWarningMatches[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }

    wrxCnt = 0;
    // Warning exceptions
    for (cmsys::RegularExpression& rx : this->WarningExceptionRegex) {
      if (rx.find(line.c_str())) {
        warningLine = 0;
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "  Not a warning Line: "
                             << line << " (matches: "
                             << this->CustomWarningExceptions[wrxCnt] << ")"
                             << std::endl,
                           this->Quiet);
        break;
      }
      wrxCnt++;
    }
  }
  if (errorLine) {
    return b_ERROR_LINE;
  }
  if (warningLine) {
    return b_WARNING_LINE;
  }
  return b_REGULAR_LINE;
}